

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

boolean walk_path(coord *src_cc,coord *dest_cc,_func_boolean_void_ptr_int_int *check_proc,void *arg)

{
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar8 = (int)src_cc->x;
  uVar3 = dest_cc->x - iVar8;
  iVar11 = (int)src_cc->y;
  uVar6 = dest_cc->y - iVar11;
  uVar7 = -uVar3;
  if (0 < (int)uVar3) {
    uVar7 = uVar3;
  }
  uVar7 = uVar7 & 0xff;
  uVar4 = (int)uVar3 >> 0x1f | 1;
  uVar3 = -uVar6;
  if (0 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar3 = uVar3 & 0xff;
  uVar6 = (int)uVar6 >> 0x1f | 1;
  if (uVar7 < uVar3) {
    iVar12 = iVar11 - uVar6;
    iVar13 = uVar3 + 1;
    iVar5 = 0;
    do {
      iVar10 = iVar8;
      iVar11 = uVar6 + iVar11;
      iVar13 = iVar13 + -1;
      if (iVar13 == 0) {
        return '\x01';
      }
      uVar9 = 0;
      uVar2 = 0;
      if ((int)uVar3 <= (int)(iVar5 + uVar7)) {
        uVar9 = uVar4;
        uVar2 = uVar3;
      }
      iVar12 = iVar12 + uVar6;
      iVar5 = (iVar5 + uVar7) - uVar2;
      bVar1 = (*check_proc)(arg,uVar9 + iVar10,iVar11);
      iVar8 = uVar9 + iVar10;
    } while (bVar1 != '\0');
  }
  else {
    iVar10 = iVar8 - uVar4;
    iVar13 = uVar7 + 1;
    iVar5 = 0;
    do {
      iVar12 = iVar11;
      iVar8 = uVar4 + iVar8;
      iVar13 = iVar13 + -1;
      if (iVar13 == 0) {
        return '\x01';
      }
      uVar9 = 0;
      uVar2 = 0;
      if ((int)uVar7 <= (int)(iVar5 + uVar3)) {
        uVar9 = uVar6;
        uVar2 = uVar7;
      }
      iVar10 = iVar10 + uVar4;
      iVar5 = (iVar5 + uVar3) - uVar2;
      bVar1 = (*check_proc)(arg,iVar8,uVar9 + iVar12);
      iVar11 = uVar9 + iVar12;
    } while (bVar1 != '\0');
  }
  dest_cc->x = (xchar)iVar10;
  dest_cc->y = (xchar)iVar12;
  return '\0';
}

Assistant:

boolean walk_path(coord *src_cc, coord *dest_cc,
		  boolean (*check_proc)(void *, int, int), void *arg)
{
    int x, y, dx, dy, x_change, y_change, err, i, prev_x, prev_y;
    boolean keep_going = TRUE;

    /* Use Bresenham's Line Algorithm to walk from src to dest */
    dx = dest_cc->x - src_cc->x;
    dy = dest_cc->y - src_cc->y;
    prev_x = x = src_cc->x;
    prev_y = y = src_cc->y;

    if (dx < 0) {
	x_change = -1;
	dx = -dx;
    } else
	x_change = 1;
    if (dy < 0) {
	y_change = -1;
	dy = -dy;
    } else
	y_change = 1;

    i = err = 0;
    if (dx < dy) {
	while (i++ < dy) {
	    prev_x = x;
	    prev_y = y;
	    y += y_change;
	    err += dx;
	    if (err >= dy) {
		x += x_change;
		err -= dy;
	    }
	/* check for early exit condition */
	if (!(keep_going = (*check_proc)(arg, x, y)))
	    break;
	}
    } else {
	while (i++ < dx) {
	    prev_x = x;
	    prev_y = y;
	    x += x_change;
	    err += dy;
	    if (err >= dx) {
		y += y_change;
		err -= dx;
	    }
	/* check for early exit condition */
	if (!(keep_going = (*check_proc)(arg, x, y)))
	    break;
	}
    }

    if (keep_going)
	return TRUE;	/* successful */

    dest_cc->x = prev_x;
    dest_cc->y = prev_y;
    return FALSE;
}